

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCofactorPerm(word *pTruth,int i,int nWords,int fSwapOnly,char *pCanonPerm,
                      uint *puCanonPhase,int fNaive)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  int t_1;
  int Config_1;
  int t;
  int Config;
  uint *puCanonPhase_local;
  char *pCanonPerm_local;
  int fSwapOnly_local;
  int nWords_local;
  int i_local;
  word *pTruth_local;
  
  bVar3 = (byte)i;
  if (fSwapOnly == 0) {
    Abc_TtCopy(Abc_TtCofactorPerm::pCopy1,pTruth,nWords,0);
    pTruth_local._4_4_ = Abc_TtCofactorPermConfig(pTruth,i,nWords,0,fNaive);
    if (pTruth_local._4_4_ == 0) {
      pTruth_local._4_4_ = 0;
    }
    else {
      iVar2 = Abc_TtCompareRev(pTruth,Abc_TtCofactorPerm::pCopy1,nWords);
      if (iVar2 == 1) {
        Abc_TtCopy(pTruth,Abc_TtCofactorPerm::pCopy1,nWords,0);
        pTruth_local._4_4_ = 0;
      }
      else {
        if ((pTruth_local._4_4_ & 1) != 0) {
          *puCanonPhase = 1 << (bVar3 & 0x1f) ^ *puCanonPhase;
        }
        if ((pTruth_local._4_4_ & 2) != 0) {
          *puCanonPhase = 1 << (bVar3 + 1 & 0x1f) ^ *puCanonPhase;
        }
        if ((pTruth_local._4_4_ & 4) != 0) {
          if ((*puCanonPhase >> (bVar3 & 0x1f) & 1) != (*puCanonPhase >> (bVar3 + 1 & 0x1f) & 1)) {
            *puCanonPhase = 1 << (bVar3 & 0x1f) ^ *puCanonPhase;
            *puCanonPhase = 1 << (bVar3 + 1 & 0x1f) ^ *puCanonPhase;
          }
          cVar1 = pCanonPerm[i];
          pCanonPerm[i] = pCanonPerm[i + 1];
          pCanonPerm[i + 1] = cVar1;
        }
      }
    }
  }
  else {
    pTruth_local._4_4_ = Abc_TtCofactorPermConfig(pTruth,i,nWords,1,0);
    if (pTruth_local._4_4_ != 0) {
      if ((*puCanonPhase >> (bVar3 & 0x1f) & 1) != (*puCanonPhase >> (bVar3 + 1 & 0x1f) & 1)) {
        *puCanonPhase = 1 << (bVar3 & 0x1f) ^ *puCanonPhase;
        *puCanonPhase = 1 << (bVar3 + 1 & 0x1f) ^ *puCanonPhase;
      }
      cVar1 = pCanonPerm[i];
      pCanonPerm[i] = pCanonPerm[i + 1];
      pCanonPerm[i + 1] = cVar1;
    }
  }
  return pTruth_local._4_4_;
}

Assistant:

int Abc_TtCofactorPerm( word * pTruth, int i, int nWords, int fSwapOnly, char * pCanonPerm, unsigned * puCanonPhase, int fNaive )
{
    if ( fSwapOnly )
    {
        int Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 1, 0 );
        if ( Config )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
    {
        static word pCopy1[1024];
        int Config;
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 0, fNaive );
        if ( Config == 0 )
            return 0;
        if ( Abc_TtCompareRev(pTruth, pCopy1, nWords) == 1 ) // made it worse
        {
            Abc_TtCopy( pTruth, pCopy1, nWords, 0 );
            return 0;
        }
        // improved
        if ( Config & 1 )
            *puCanonPhase ^= (1 << i);
        if ( Config & 2 )
            *puCanonPhase ^= (1 << (i+1));
        if ( Config & 4 )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
}